

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O0

int findnexte(int M)

{
  int iVar1;
  int local_10;
  int N;
  int M_local;
  
  for (local_10 = M; iVar1 = factorf(local_10), iVar1 != 1 || local_10 % 2 != 0;
      local_10 = local_10 + 1) {
  }
  return local_10;
}

Assistant:

int findnexte(int M) {
	int N;
	N = M;

	while (factorf(N) != 1 || N%2 != 0) {
		++N;
	}

	return N;

}